

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O1

ByteData * __thiscall
cfd::core::ByteData160::PushBack<cfd::core::ByteData256>
          (ByteData *__return_storage_ptr__,ByteData160 *this,ByteData256 *back_insert_data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> insert_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,&this->data_);
  ByteData256::GetBytes(&local_40,back_insert_data);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,
             local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  ByteData::ByteData(__return_storage_ptr__,&local_28);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData PushBack(const ByteDataClass& back_insert_data) const {
    std::vector<uint8_t> result(data_);
    std::vector<uint8_t> insert_bytes = back_insert_data.GetBytes();
    result.insert(result.end(), insert_bytes.begin(), insert_bytes.end());
    return ByteData(result);
  }